

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O0

size_t __thiscall
google::protobuf::hash<google::protobuf::MapKey>::operator()
          (hash<google::protobuf::MapKey> *this,MapKey *map_key)

{
  bool x;
  CppType CVar1;
  int32 __val;
  uint32 __val_00;
  string *key;
  int64 __val_01;
  uint64 __val_02;
  LogMessage *pLVar2;
  LogFinisher local_a9;
  LogMessage local_a8;
  hash<bool> local_6b;
  hash<unsigned_int> local_6a;
  hash<unsigned_long> local_69;
  hash<int> local_68;
  hash<long> local_67;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_66;
  LogFinisher local_65 [13];
  LogMessage local_58;
  MapKey *local_20;
  MapKey *map_key_local;
  hash<google::protobuf::MapKey> *this_local;
  
  local_20 = map_key;
  map_key_local = (MapKey *)this;
  CVar1 = MapKey::type(map_key);
  switch(CVar1) {
  case CPPTYPE_INT32:
    __val = MapKey::GetInt32Value(local_20);
    this_local = (hash<google::protobuf::MapKey> *)std::hash<int>::operator()(&local_68,__val);
    break;
  case CPPTYPE_INT64:
    __val_01 = MapKey::GetInt64Value(local_20);
    this_local = (hash<google::protobuf::MapKey> *)std::hash<long>::operator()(&local_67,__val_01);
    break;
  case CPPTYPE_UINT32:
    __val_00 = MapKey::GetUInt32Value(local_20);
    this_local = (hash<google::protobuf::MapKey> *)
                 std::hash<unsigned_int>::operator()(&local_6a,__val_00);
    break;
  case CPPTYPE_UINT64:
    __val_02 = MapKey::GetUInt64Value(local_20);
    this_local = (hash<google::protobuf::MapKey> *)
                 std::hash<unsigned_long>::operator()(&local_69,__val_02);
    break;
  case CPPTYPE_DOUBLE:
  case CPPTYPE_FLOAT:
  case CPPTYPE_ENUM:
  case CPPTYPE_MESSAGE:
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/map_field.h"
               ,0x310);
    pLVar2 = internal::LogMessage::operator<<(&local_58,"Unsupported");
    internal::LogFinisher::operator=(local_65,pLVar2);
    internal::LogMessage::~LogMessage(&local_58);
  default:
    internal::LogMessage::LogMessage
              (&local_a8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/map_field.h"
               ,799);
    pLVar2 = internal::LogMessage::operator<<(&local_a8,"Can\'t get here.");
    internal::LogFinisher::operator=(&local_a9,pLVar2);
    internal::LogMessage::~LogMessage(&local_a8);
    this_local = (hash<google::protobuf::MapKey> *)0x0;
    break;
  case CPPTYPE_BOOL:
    x = MapKey::GetBoolValue(local_20);
    this_local = (hash<google::protobuf::MapKey> *)hash<bool>::operator()(&local_6b,x);
    break;
  case CPPTYPE_STRING:
    key = MapKey::GetStringValue_abi_cxx11_(local_20);
    this_local = (hash<google::protobuf::MapKey> *)
                 hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator()(&local_66,key);
  }
  return (size_t)this_local;
}

Assistant:

size_t
  operator()(const google::protobuf::MapKey& map_key) const {
    switch (map_key.type()) {
      case google::protobuf::FieldDescriptor::CPPTYPE_DOUBLE:
      case google::protobuf::FieldDescriptor::CPPTYPE_FLOAT:
      case google::protobuf::FieldDescriptor::CPPTYPE_ENUM:
      case google::protobuf::FieldDescriptor::CPPTYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Unsupported";
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_STRING:
        return hash<string>()(map_key.GetStringValue());
      case google::protobuf::FieldDescriptor::CPPTYPE_INT64:
        return hash< ::google::protobuf::int64>()(map_key.GetInt64Value());
      case google::protobuf::FieldDescriptor::CPPTYPE_INT32:
        return hash< ::google::protobuf::int32>()(map_key.GetInt32Value());
      case google::protobuf::FieldDescriptor::CPPTYPE_UINT64:
        return hash< ::google::protobuf::uint64>()(map_key.GetUInt64Value());
      case google::protobuf::FieldDescriptor::CPPTYPE_UINT32:
        return hash< ::google::protobuf::uint32>()(map_key.GetUInt32Value());
      case google::protobuf::FieldDescriptor::CPPTYPE_BOOL:
        return hash<bool>()(map_key.GetBoolValue());
    }
    GOOGLE_LOG(FATAL) << "Can't get here.";
    return 0;
  }